

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O3

int get_font_align(char *value)

{
  int iVar1;
  int iVar2;
  
  iVar1 = strcmp(value,"ALLEGRO_ALIGN_LEFT");
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = strcmp(value,"ALLEGRO_ALIGN_CENTRE");
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = strcmp(value,"ALLEGRO_ALIGN_RIGHT");
      if (iVar1 == 0) {
        iVar1 = 2;
      }
      else {
        iVar2 = strcmp(value,"ALLEGRO_ALIGN_INTEGER");
        iVar1 = 4;
        if (iVar2 != 0) {
          iVar2 = strcmp(value,"ALLEGRO_ALIGN_LEFT|ALLEGRO_ALIGN_INTEGER");
          if (iVar2 != 0) {
            iVar1 = strcmp(value,"ALLEGRO_ALIGN_RIGHT|ALLEGRO_ALIGN_INTEGER");
            if (iVar1 == 0) {
              iVar1 = 6;
            }
            else {
              iVar1 = strcmp(value,"ALLEGRO_ALIGN_CENTRE|ALLEGRO_ALIGN_INTEGER");
              if (iVar1 != 0) {
                iVar1 = atoi(value);
                return iVar1;
              }
              iVar1 = 5;
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int get_font_align(char const *value)
{
   return streq(value, "ALLEGRO_ALIGN_LEFT") ? ALLEGRO_ALIGN_LEFT
      : streq(value, "ALLEGRO_ALIGN_CENTRE") ? ALLEGRO_ALIGN_CENTRE
      : streq(value, "ALLEGRO_ALIGN_RIGHT") ? ALLEGRO_ALIGN_RIGHT
      : streq(value, "ALLEGRO_ALIGN_INTEGER") ? ALLEGRO_ALIGN_INTEGER
      : streq(value, "ALLEGRO_ALIGN_LEFT|ALLEGRO_ALIGN_INTEGER")
         ? ALLEGRO_ALIGN_LEFT | ALLEGRO_ALIGN_INTEGER
      : streq(value, "ALLEGRO_ALIGN_RIGHT|ALLEGRO_ALIGN_INTEGER")
         ? ALLEGRO_ALIGN_RIGHT | ALLEGRO_ALIGN_INTEGER
      : streq(value, "ALLEGRO_ALIGN_CENTRE|ALLEGRO_ALIGN_INTEGER")
         ? ALLEGRO_ALIGN_CENTRE | ALLEGRO_ALIGN_INTEGER
      : atoi(value);
}